

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_0::FragmentShader::shadeFragments
          (FragmentShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  deUint32 dVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  int iVar7;
  GenericVec4 *pGVar8;
  uint uVar9;
  int i;
  TextureChannelClass TVar10;
  long lVar11;
  int iVar12;
  int fragNdx;
  int fragNdx_00;
  uint uVar13;
  FragmentPacket *packet;
  int iVar14;
  float values [4];
  Vec2 vColor;
  rr *local_78;
  float local_70 [4];
  undefined8 local_60;
  ulong local_58;
  FragmentPacket *local_50;
  ulong local_48;
  rr local_40 [16];
  
  if (0 < numPackets) {
    local_58 = (ulong)(uint)numPackets;
    local_48 = 0;
    local_50 = packets;
    do {
      packet = local_50 + local_48;
      iVar14 = (int)local_48 * 4;
      fragNdx_00 = 0;
      do {
        rr::readVarying<float>(local_40,packet,context,0,fragNdx_00);
        local_78 = local_40;
        local_70[0] = 0.0;
        local_70[1] = 1.4013e-45;
        local_60 = (rr *)0x0;
        lVar11 = 0;
        do {
          *(undefined4 *)((long)&local_60 + lVar11 * 4) =
               *(undefined4 *)(local_40 + (long)(int)local_70[lVar11] * 4);
          lVar11 = lVar11 + 1;
        } while (lVar11 == 1);
        local_78 = local_60;
        local_70[1] = 1.0 - local_60._4_4_;
        local_70[0] = 1.0 - (float)local_60;
        TVar10 = tcu::getTextureChannelClass((this->m_info).m_format.type);
        switch(TVar10) {
        case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
        case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
        case TEXTURECHANNELCLASS_FLOATING_POINT:
          iVar7 = this->m_drawBufferNdx;
          uVar13 = iVar7 + 4;
          if (-1 < (int)(iVar7 + 1U)) {
            uVar13 = iVar7 + 1U;
          }
          dVar1 = *(deUint32 *)
                   ((long)&local_78 + (long)(int)((iVar7 - (uVar13 & 0xfffffffc)) + 1) * 4);
          uVar13 = iVar7 + 5;
          if (-1 < (int)(iVar7 + 2U)) {
            uVar13 = iVar7 + 2U;
          }
          uVar9 = iVar7 + 6;
          if (-1 < (int)(iVar7 + 3U)) {
            uVar9 = iVar7 + 3U;
          }
          dVar2 = *(deUint32 *)
                   ((long)&local_78 + (long)(int)((iVar7 - (uVar13 & 0xfffffffc)) + 2) * 4);
          dVar3 = *(deUint32 *)
                   ((long)&local_78 + (long)(int)((iVar7 - (uVar9 & 0xfffffffc)) + 3) * 4);
          pGVar8 = context->outputArray;
          iVar12 = (iVar14 + fragNdx_00) * context->numFragmentOutputs;
          pGVar8[iVar12].v.uData[0] = *(deUint32 *)((long)&local_78 + (long)(iVar7 % 4) * 4);
          pGVar8[iVar12].v.uData[1] = dVar1;
          pGVar8[iVar12].v.uData[2] = dVar2;
          pGVar8[iVar12].v.uData[3] = dVar3;
          break;
        case TEXTURECHANNELCLASS_SIGNED_INTEGER:
          iVar7 = this->m_drawBufferNdx;
          uVar13 = iVar7 + 4;
          if (-1 < (int)(iVar7 + 1U)) {
            uVar13 = iVar7 + 1U;
          }
          fVar4 = *(float *)((long)&local_78 + (long)(int)((iVar7 - (uVar13 & 0xfffffffc)) + 1) * 4)
          ;
          uVar13 = iVar7 + 5;
          if (-1 < (int)(iVar7 + 2U)) {
            uVar13 = iVar7 + 2U;
          }
          fVar5 = *(float *)((long)&local_78 + (long)(int)((iVar7 - (uVar13 & 0xfffffffc)) + 2) * 4)
          ;
          uVar13 = iVar7 + 6;
          if (-1 < (int)(iVar7 + 3U)) {
            uVar13 = iVar7 + 3U;
          }
          fVar6 = *(float *)((long)&local_78 + (long)(int)((iVar7 - (uVar13 & 0xfffffffc)) + 3) * 4)
          ;
          pGVar8 = context->outputArray;
          iVar12 = (iVar14 + fragNdx_00) * context->numFragmentOutputs;
          pGVar8[iVar12].v.uData[0] = (int)*(float *)((long)&local_78 + (long)(iVar7 % 4) * 4);
          pGVar8[iVar12].v.uData[1] = (int)fVar4;
          pGVar8[iVar12].v.uData[2] = (int)fVar5;
          pGVar8[iVar12].v.uData[3] = (int)fVar6;
          break;
        case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
          iVar7 = this->m_drawBufferNdx;
          uVar13 = iVar7 + 4;
          if (-1 < (int)(iVar7 + 1U)) {
            uVar13 = iVar7 + 1U;
          }
          fVar4 = *(float *)((long)&local_78 + (long)(int)((iVar7 - (uVar13 & 0xfffffffc)) + 1) * 4)
          ;
          uVar13 = iVar7 + 5;
          if (-1 < (int)(iVar7 + 2U)) {
            uVar13 = iVar7 + 2U;
          }
          fVar5 = *(float *)((long)&local_78 + (long)(int)((iVar7 - (uVar13 & 0xfffffffc)) + 2) * 4)
          ;
          uVar13 = iVar7 + 6;
          if (-1 < (int)(iVar7 + 3U)) {
            uVar13 = iVar7 + 3U;
          }
          fVar6 = *(float *)((long)&local_78 + (long)(int)((iVar7 - (uVar13 & 0xfffffffc)) + 3) * 4)
          ;
          pGVar8 = context->outputArray;
          iVar12 = (iVar14 + fragNdx_00) * context->numFragmentOutputs;
          pGVar8[iVar12].v.uData[0] =
               (deUint32)(long)*(float *)((long)&local_78 + (long)(iVar7 % 4) * 4);
          pGVar8[iVar12].v.uData[1] = (deUint32)(long)fVar4;
          pGVar8[iVar12].v.uData[2] = (deUint32)(long)fVar5;
          pGVar8[iVar12].v.uData[3] = (deUint32)(long)fVar6;
        }
        fragNdx_00 = fragNdx_00 + 1;
      } while (fragNdx_00 != 4);
      local_48 = local_48 + 1;
    } while (local_48 != local_58);
  }
  return;
}

Assistant:

void FragmentShader::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		rr::FragmentPacket& packet = packets[packetNdx];

		DE_ASSERT(m_drawBufferNdx >= 0);
		DE_UNREF(m_info);

		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
		{
			const Vec2	vColor		= rr::readVarying<float>(packet, context, 0, fragNdx).xy();
			const float	values[]	=
			{
				vColor.x(),
				vColor.y(),
				(1.0f - vColor.x()),
				(1.0f - vColor.y())
			};

			switch (tcu::getTextureChannelClass(m_info.getFormat().type))
			{
				case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
				case tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
				case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
				{
					const Vec4 color (values[(m_drawBufferNdx + 0) % 4],
									  values[(m_drawBufferNdx + 1) % 4],
									  values[(m_drawBufferNdx + 2) % 4],
									  values[(m_drawBufferNdx + 3) % 4]);

					rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
					break;
				}

				case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
				{
					const UVec4 color ((deUint32)(values[(m_drawBufferNdx + 0) % 4]),
									   (deUint32)(values[(m_drawBufferNdx + 1) % 4]),
									   (deUint32)(values[(m_drawBufferNdx + 2) % 4]),
									   (deUint32)(values[(m_drawBufferNdx + 3) % 4]));

					rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
					break;
				}

				case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
				{
					const IVec4 color ((deInt32)(values[(m_drawBufferNdx + 0) % 4]),
									   (deInt32)(values[(m_drawBufferNdx + 1) % 4]),
									   (deInt32)(values[(m_drawBufferNdx + 2) % 4]),
									   (deInt32)(values[(m_drawBufferNdx + 3) % 4]));

					rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
					break;
				}

				default:
					DE_ASSERT(DE_FALSE);
			};
		}
	}
}